

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O0

void Ifn_NtkAddConstraints(Ifn_Ntk_t *p,sat_solver *pSat)

{
  int iVar3;
  uint uVar4;
  word wVar5;
  int iVar2;
  int iVar1;
  int fForceDiff;
  int pVars_1 [22];
  int local_a0;
  int RetValue_1;
  int k_1;
  int i_1;
  word pTruth [4];
  int local_68;
  int RetValue;
  int pVars [11];
  int local_34;
  int k;
  int i;
  word uTruth;
  Vec_Int_t *vCover;
  sat_solver *psStack_18;
  int fAddConstr;
  sat_solver *pSat_local;
  Ifn_Ntk_t *p_local;
  
  vCover._4_4_ = 1;
  psStack_18 = pSat;
  pSat_local = (sat_solver *)p;
  uTruth = (word)Vec_IntAlloc(0);
  wVar5 = Abc_Tt6Mask(*(int *)&pSat_local[2].tagged.ptr);
  _k = Abc_Tt6Stretch(wVar5 ^ 0xffffffffffffffff,pSat_local[2].stack.cap);
  if (4 < pSat_local[2].stack.cap) {
    __assert_fail("p->nParsVNum <= 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifTune.c"
                  ,0x422,"void Ifn_NtkAddConstraints(Ifn_Ntk_t *, sat_solver *)");
  }
  if (_k != 0) {
    iVar3 = Kit_TruthIsop((uint *)&k,pSat_local[2].stack.cap,(Vec_Int_t *)uTruth,0);
    if (iVar3 != 0) {
      __assert_fail("RetValue == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifTune.c"
                    ,0x427,"void Ifn_NtkAddConstraints(Ifn_Ntk_t *, sat_solver *)");
    }
    for (local_34 = 0; local_34 < pSat_local->size; local_34 = local_34 + 1) {
      for (pVars[10] = 0; pVars[10] < pSat_local[2].stack.cap; pVars[10] = pVars[10] + 1) {
        (&local_68)[pVars[10]] =
             pSat_local[2].stack.size + local_34 * pSat_local[2].stack.cap + pVars[10];
      }
      Ifn_NtkAddConstrOne(psStack_18,(Vec_Int_t *)uTruth,&local_68,pSat_local[2].stack.cap);
    }
  }
  if ((vCover._4_4_ != 0) && (pSat_local[2].tagged.size != 0)) {
    uVar4 = (uint)(*(int *)&pSat_local[2].tagged.ptr == pSat_local->size);
    Ifn_TtComparisonConstr((word *)&k_1,pSat_local[2].stack.cap,uVar4,uVar4);
    iVar3 = Kit_TruthIsop((uint *)&k_1,pSat_local[2].stack.cap << 1,(Vec_Int_t *)uTruth,0);
    if (iVar3 != 0) {
      __assert_fail("RetValue == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifTune.c"
                    ,0x439,"void Ifn_NtkAddConstraints(Ifn_Ntk_t *, sat_solver *)");
    }
    for (RetValue_1 = 0; RetValue_1 < pSat_local[2].tagged.size; RetValue_1 = RetValue_1 + 1) {
      iVar3 = *(int *)((long)&pSat_local[1].stats.clauses_literals + (long)RetValue_1 * 4);
      uVar4 = *(uint *)((long)&pSat_local[1].stats.clauses_literals + (long)RetValue_1 * 4);
      for (local_a0 = 0; local_a0 < pSat_local[2].stack.cap; local_a0 = local_a0 + 1) {
        (&iVar1)[local_a0 << 1] =
             pSat_local[2].stack.size + (iVar3 >> 0x10) * pSat_local[2].stack.cap + local_a0;
        (&iVar1)[local_a0 * 2 + 1] =
             pSat_local[2].stack.size + (uVar4 & 0xffff) * pSat_local[2].stack.cap + local_a0;
      }
      Ifn_NtkAddConstrOne(psStack_18,(Vec_Int_t *)uTruth,&iVar1,pSat_local[2].stack.cap << 1);
    }
  }
  Vec_IntFree((Vec_Int_t *)uTruth);
  return;
}

Assistant:

void Ifn_NtkAddConstraints( Ifn_Ntk_t * p, sat_solver * pSat )
{
    int fAddConstr = 1;
    Vec_Int_t * vCover = Vec_IntAlloc( 0 );
    word uTruth = Abc_Tt6Stretch( ~Abc_Tt6Mask(p->nVars), p->nParsVNum );
    assert( p->nParsVNum <= 4 );
    if ( uTruth )
    {
        int i, k, pVars[IFN_INS];
        int RetValue = Kit_TruthIsop( (unsigned *)&uTruth, p->nParsVNum, vCover, 0 );
        assert( RetValue == 0 );
//        Dau_DsdPrintFromTruth( &uTruth, p->nParsVNum );
        // add capacity constraints
        for ( i = 0; i < p->nInps; i++ )
        {
            for ( k = 0; k < p->nParsVNum; k++ )
                pVars[k] = p->nParsVIni + i * p->nParsVNum + k;
            Ifn_NtkAddConstrOne( pSat, vCover, pVars, p->nParsVNum );
        }
    }
    // ordering constraints
    if ( fAddConstr && p->nConstr )
    {
        word pTruth[4];
        int i, k, RetValue, pVars[2*IFN_INS];
        int fForceDiff = (p->nVars == p->nInps);
        Ifn_TtComparisonConstr( pTruth, p->nParsVNum, fForceDiff, fForceDiff );
        RetValue = Kit_TruthIsop( (unsigned *)pTruth, 2*p->nParsVNum, vCover, 0 );
        assert( RetValue == 0 );
//        Kit_TruthIsopPrintCover( vCover, 2*p->nParsVNum, 0 );
        for ( i = 0; i < p->nConstr; i++ )
        {
            int iVar1 = p->pConstr[i] >> 16;
            int iVar2 = p->pConstr[i] & 0xFFFF;
            for ( k = 0; k < p->nParsVNum; k++ )
            {
                pVars[2*k+0] = p->nParsVIni + iVar1 * p->nParsVNum + k;
                pVars[2*k+1] = p->nParsVIni + iVar2 * p->nParsVNum + k;
            }
            Ifn_NtkAddConstrOne( pSat, vCover, pVars, 2*p->nParsVNum );
//            printf( "added constraint with %d clauses for %d and %d\n", Vec_IntSize(vCover), iVar1, iVar2 );
        }
    }
    Vec_IntFree( vCover );
}